

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
* __thiscall
fp::Algorithm::BackTrack
          (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
           *__return_storage_ptr__,Algorithm *this,array<int,_2UL> current_node,
          array<std::array<fp::Node,_16UL>,_16UL> *node)

{
  bool bVar1;
  array<int,_2UL> parent_node;
  array<int,_2UL> local_38;
  array<int,_2UL> local_30;
  
  local_38._M_elems =
       *&node->_M_elems[current_node._M_elems[0]]._M_elems[(long)current_node._M_elems >> 0x20].
         parent_node_._M_elems;
  local_30._M_elems = current_node._M_elems;
  while( true ) {
    std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::push_back
              (&(this->path_stack_).c,&local_30);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) break;
    Maze::ColorPath(local_30);
    local_30._M_elems[0] = local_38._M_elems[0];
    local_30._M_elems[1] = local_38._M_elems[1];
    local_38._M_elems =
         *&node->_M_elems[local_38._M_elems[0]]._M_elems[(long)local_38._M_elems >> 0x20].
           parent_node_._M_elems;
  }
  std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::deque
            (&__return_storage_ptr__->c,&(this->path_stack_).c);
  return __return_storage_ptr__;
}

Assistant:

std::stack<std::array<int, 2>>
fp::Algorithm::BackTrack(std::array<int, 2> current_node, std::array<std::array<Node, 16>, 16> &node) {
    std::array<int, 2> parent_node = node[current_node[0]][current_node[1]].parent_node_;
    this->path_stack_.push(current_node);
    while (!(current_node == parent_node)) {
        fp::Maze::ColorPath(current_node);
        current_node = parent_node;
        parent_node = node[current_node[0]][current_node[1]].parent_node_;
        this->path_stack_.push(current_node);
    }
    return this->path_stack_;
}